

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void getDWPTCoeffs(wpt_object wt,int X,int Y,double *coeffs,int N)

{
  int iVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  char *__format;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  uVar3 = wt->J;
  if ((X < 1) || ((int)uVar3 < X)) {
    __format = "X co-ordinate must be >= 1 and <= %d";
  }
  else {
    iVar5 = 1;
    iVar6 = X;
    do {
      iVar5 = iVar5 * 2;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    if ((-1 < Y) && (Y < iVar5)) {
      if (X < (int)uVar3) {
        iVar5 = 0;
        iVar6 = 0;
        do {
          iVar1 = wt->numnodeslevel[uVar3];
          iVar6 = iVar6 + iVar1;
          iVar5 = iVar5 + iVar1 * wt->coeflength[uVar3];
          uVar3 = uVar3 - 1;
        } while (X < (int)uVar3);
        lVar7 = (long)iVar6;
      }
      else {
        lVar7 = 0;
        iVar5 = 0;
      }
      iVar6 = wt->numnodeslevel[(uint)X];
      if (0 < iVar6) {
        lVar8 = 0;
        do {
          if (wt->nodeindex[lVar7 * 2 + lVar8 * 2 + 1] == Y) {
            if (0 < N) {
              pdVar2 = wt->output;
              uVar4 = 0;
              do {
                coeffs[uVar4] = pdVar2[(long)iVar5 + uVar4];
                uVar4 = uVar4 + 1;
              } while ((uint)N != uVar4);
            }
            return;
          }
          iVar5 = iVar5 + wt->coeflength[(uint)X];
          lVar8 = lVar8 + 1;
        } while (iVar6 != (int)lVar8);
      }
      puts(
          "The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes "
          );
      goto LAB_001051ab;
    }
    uVar3 = iVar5 - 1;
    __format = "Y co-ordinate must be >= 0 and <= %d";
  }
  printf(__format,(ulong)uVar3);
LAB_001051ab:
  exit(-1);
}

Assistant:

void getDWPTCoeffs(wpt_object wt, int X, int Y, double *coeffs, int N) {
	int ymax, i;
	int np,citer;
	int flag;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 || Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	np = 0;
	citer = 0;

	for (i = wt->J; i > X; --i) {
		np += wt->numnodeslevel[i];
		citer += wt->numnodeslevel[i] * wt->coeflength[i];
	}

	i = 0;
	flag = 0;
	for (i = 0; i < wt->numnodeslevel[X]; ++i) {
		if (wt->nodeindex[2 * np + 1] == Y) {
			flag = 1;
			break;
		}
		np++;
		citer += wt->coeflength[X];
	}

	if (flag == 0) {
		printf("The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes \n");
		exit(-1);
	}

	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[citer + i];
	}

}